

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsTraceExternalReference(JsRuntimeHandle runtimeHandle,JsValueRef value)

{
  ThreadContext *threadContext;
  JsrtRuntime *pJVar1;
  JsErrorCode JVar2;
  AutoNestedHandledExceptionType local_58 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_30;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    pJVar1 = JsrtRuntime::FromHandle(runtimeHandle);
    threadContext = pJVar1->threadContext;
    ThreadContextScope::ThreadContextScope(&local_30,threadContext);
    JVar2 = JsErrorWrongThread;
    if (local_30.isValid == true) {
      JVar2 = JsNoError;
      Memory::Recycler::TryExternalMarkNonInterior(threadContext->recycler,value);
    }
    ThreadContextScope::~ThreadContextScope(&local_30);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  return JVar2;
}

Assistant:

CHAKRA_API JsTraceExternalReference(_In_ JsRuntimeHandle runtimeHandle, _In_ JsValueRef value)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        recycler->TryExternalMarkNonInterior(value);
        return JsNoError;
    });
}